

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

int message_get_message_format(MESSAGE_HANDLE message,uint32_t *message_format)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (message == (MESSAGE_HANDLE)0x0 || message_format == (uint32_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x5cd;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                ,"message_get_message_format",0x5cc,1,
                "Bad arguments: message = %p, message_format = %p",message,message_format);
    }
  }
  else {
    *message_format = message->message_format;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int message_get_message_format(MESSAGE_HANDLE message, uint32_t* message_format)
{
    int result;

    if ((message == NULL) ||
        (message_format == NULL))
    {
        /* Codes_SRS_MESSAGE_01_134: [ If `message` or `message_format` is NULL, `message_get_message_format` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, message_format = %p",
            message, message_format);
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_MESSAGE_01_132: [ `message_get_message_format` shall get the message format for the message identified by `message` and return it in the `message_fomrat` argument. ]*/
        *message_format = message->message_format;

        /* Codes_SRS_MESSAGE_01_133: [ On success, `message_get_message_format` shall return 0. ]*/
        result = 0;
    }

    return result;
}